

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLEventsSourceTests.cpp
# Opt level: O2

void __thiscall
solitaire::events::SDLEventsSourceTests_returnMouseLeftButtonDownEvent_Test::TestBody
          (SDLEventsSourceTests_returnMouseLeftButtonDownEvent_Test *this)

{
  TypedExpectation<int_(SDL_Event_&)> *this_00;
  variant_alternative_t<1UL,_variant<NoEvents,_MouseLeftButtonDown,_MouseLeftButtonUp,_MouseMove,_Quit>_>
  *lhs;
  SDLEventsSource *this_01;
  char *message;
  MatcherBase<SDL_Event_&> local_90;
  _Variadic_union<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
  local_78;
  MatcherBase<SDL_Event_&> local_70;
  AssertionResult gtest_ar;
  MouseLeftButtonDown mouseLeftButtonDown;
  
  local_90.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<SDL_Event&>::
       GetVTable<testing::internal::MatcherBase<SDL_Event&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_90.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_002f52c8;
  SDL::WrapperMock::gmock_pollEvent
            ((MockSpec<int_(SDL_Event_&)> *)&local_78,
             (this->super_SDLEventsSourceTests).sdlMock.rawPointer,(Matcher<SDL_Event_&> *)&local_90
            );
  testing::internal::GetWithoutMatchers();
  this_00 = testing::internal::MockSpec<int_(SDL_Event_&)>::InternalExpectedAt
                      ((MockSpec<int_(SDL_Event_&)> *)&local_78,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp"
                       ,0x3f,"*sdlMock","pollEvent(_)");
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  this_01 = (SDLEventsSource *)&mouseLeftButtonDown;
  mouseLeftButtonDown.position.x = 0;
  mouseLeftButtonDown.position.y = 0;
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar);
  testing::internal::TypedExpectation<int_(SDL_Event_&)>::WillOnce
            (this_00,(Action<int_(SDL_Event_&)> *)this_01);
  std::_Function_base::~_Function_base((_Function_base *)&mouseLeftButtonDown);
  testing::internal::MatcherBase<SDL_Event_&>::~MatcherBase(&local_70);
  testing::internal::MatcherBase<SDL_Event_&>::~MatcherBase(&local_90);
  mouseLeftButtonDown.position.x = 100;
  mouseLeftButtonDown.position.y = 0x78;
  local_78 = (_Variadic_union<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
              )SDLEventsSource::getEvent
                         ((Event *)&(this->super_SDLEventsSourceTests).eventsSource,this_01);
  lhs = std::
        get<1ul,solitaire::events::NoEvents,solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonUp,solitaire::events::MouseMove,solitaire::events::Quit>
                  ((variant<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
                    *)&local_78);
  testing::internal::
  CmpHelperEQ<solitaire::events::MouseLeftButtonDown,solitaire::events::MouseLeftButtonDown>
            ((internal *)&gtest_ar,"std::get<MouseLeftButtonDown>(eventsSource.getEvent())",
             "mouseLeftButtonDown",lhs,&mouseLeftButtonDown);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_78);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = "";
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/events/SDLEventsSourceTests.cpp"
               ,0x48,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_90,(Message *)&local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_90);
    if (local_78 !=
        (_Variadic_union<solitaire::events::NoEvents,_solitaire::events::MouseLeftButtonDown,_solitaire::events::MouseLeftButtonUp,_solitaire::events::MouseMove,_solitaire::events::Quit>
         )0x0) {
      (**(code **)(*(long *)local_78 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  return;
}

Assistant:

TEST_F(SDLEventsSourceTests, returnMouseLeftButtonDownEvent) {
    EXPECT_CALL(*sdlMock, pollEvent(_)).WillOnce(Invoke([](auto& event) {
        event.type = SDL_MOUSEBUTTONDOWN;
        event.button.button = SDL_BUTTON_LEFT;
        event.button.x = x;
        event.button.y = y;
        return 1;
    }));

    MouseLeftButtonDown mouseLeftButtonDown {x, y};
    EXPECT_EQ(std::get<MouseLeftButtonDown>(eventsSource.getEvent()), mouseLeftButtonDown);
}